

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

CServerFilter * __thiscall
CServerBrowserFilter::CServerFilter::operator=(CServerFilter *this,CServerFilter *Other)

{
  int *piVar1;
  int *piVar2;
  int i;
  long lVar3;
  int iVar4;
  
  if (Other != this) {
    this->m_pServerBrowserFilter = Other->m_pServerBrowserFilter;
    CServerFilterInfo::Set(&this->m_FilterInfo,&Other->m_FilterInfo);
    iVar4 = Other->m_NumSortedServers;
    this->m_NumSortedPlayers = Other->m_NumSortedPlayers;
    this->m_NumSortedServers = iVar4;
    iVar4 = Other->m_SortedServersCapacity;
    this->m_SortedServersCapacity = iVar4;
    if (this->m_pSortedServerlist != (int *)0x0) {
      mem_free(this->m_pSortedServerlist);
      iVar4 = this->m_SortedServersCapacity;
    }
    piVar2 = (int *)mem_alloc(iVar4 << 2);
    this->m_pSortedServerlist = piVar2;
    piVar1 = Other->m_pSortedServerlist;
    for (lVar3 = 0; lVar3 < this->m_SortedServersCapacity; lVar3 = lVar3 + 1) {
      piVar2[lVar3] = piVar1[lVar3];
    }
  }
  return this;
}

Assistant:

CServerBrowserFilter::CServerFilter& CServerBrowserFilter::CServerFilter::operator=(const CServerBrowserFilter::CServerFilter& Other)
{
	if(&Other != this)
	{
		m_pServerBrowserFilter = Other.m_pServerBrowserFilter;
		m_FilterInfo.Set(&Other.m_FilterInfo);
		m_NumSortedPlayers = Other.m_NumSortedPlayers;
		m_NumSortedServers = Other.m_NumSortedServers;
		m_SortedServersCapacity = Other.m_SortedServersCapacity;

		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity * sizeof(int));
		for(int i = 0; i < m_SortedServersCapacity; ++i)
			m_pSortedServerlist[i] = Other.m_pSortedServerlist[i];
	}
	return *this;
}